

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

void __thiscall cmListFileBacktrace::Entry::Entry(Entry *this,cmListFileContext *lfc,Entry *up)

{
  pointer pcVar1;
  
  (this->super_cmListFileContext).Name._M_dataplus._M_p =
       (pointer)&(this->super_cmListFileContext).Name.field_2;
  pcVar1 = (lfc->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (lfc->Name)._M_string_length);
  (this->super_cmListFileContext).FilePath._M_dataplus._M_p =
       (pointer)&(this->super_cmListFileContext).FilePath.field_2;
  pcVar1 = (lfc->FilePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_cmListFileContext).FilePath,pcVar1,
             pcVar1 + (lfc->FilePath)._M_string_length);
  (this->super_cmListFileContext).Line = lfc->Line;
  this->Up = up;
  this->RefCount = 0;
  if (up != (Entry *)0x0) {
    up->RefCount = up->RefCount + 1;
  }
  return;
}

Assistant:

Entry(cmListFileContext const& lfc, Entry* up)
    : cmListFileContext(lfc)
    , Up(up)
    , RefCount(0)
  {
    if (this->Up) {
      this->Up->Ref();
    }
  }